

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

void QVariantAnimation::registerInterpolator(Interpolator func,int interpolationType)

{
  Type *this;
  qsizetype qVar1;
  int in_ESI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  QInterpolatorVector *interpolators;
  scoped_lock<QBasicMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_registeredInterpolators>_>
  *in_stack_ffffffffffffffb8;
  qsizetype in_stack_ffffffffffffffc8;
  QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *in_stack_ffffffffffffffd0;
  undefined1 *i;
  QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *this_00;
  
  this_00 = *(QList<QVariant_(*)(const_void_*,_const_void_*,_double)> **)(in_FS_OFFSET + 0x28);
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_registeredInterpolators>_>
         ::operator()(in_stack_ffffffffffffffb8);
  if (this != (Type *)0x0) {
    i = &DAT_aaaaaaaaaaaaaaaa;
    (anonymous_namespace)::qt_scoped_lock<QBasicMutex,std::scoped_lock<QBasicMutex>>
              ((QBasicMutex *)in_stack_ffffffffffffffb8);
    qVar1 = QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::size(this);
    if (qVar1 <= in_ESI) {
      QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::resize
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::replace(this_00,(qsizetype)i,in_RDI);
    std::scoped_lock<QBasicMutex>::~scoped_lock((scoped_lock<QBasicMutex> *)0x68ee2f);
  }
  if (*(QList<QVariant_(*)(const_void_*,_const_void_*,_double)> **)(in_FS_OFFSET + 0x28) == this_00)
  {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimation::registerInterpolator(QVariantAnimation::Interpolator func, int interpolationType)
{
    // will override any existing interpolators
    QInterpolatorVector *interpolators = registeredInterpolators();
    // When built on solaris with GCC, the destructors can be called
    // in such an order that we get here with interpolators == NULL,
    // to continue causes the app to crash on exit with a SEGV
    if (interpolators) {
        const auto locker = qt_scoped_lock(registeredInterpolatorsMutex);
        if (interpolationType >= interpolators->size())
            interpolators->resize(interpolationType + 1);
        interpolators->replace(interpolationType, func);
    }
}